

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O1

void acutest_finish_test_line_(int result)

{
  char *pcVar1;
  
  if (acutest_tap_ == '\x01') {
    pcVar1 = "not ok";
    if (result == 0) {
      pcVar1 = "ok";
    }
    printf("%s %d - %s\n",pcVar1,(ulong)(acutest_current_index_ + 1),acutest_current_test_->name);
    if ((result != 0) || (acutest_timer_ == 0)) {
      return;
    }
    pcVar1 = "# Duration: ";
  }
  else {
    pcVar1 = "FAILED";
    if (result == 0) {
      pcVar1 = "OK";
    }
    printf("[ ");
    acutest_colored_printf_(result == 0 ^ 5,"%s",pcVar1);
    printf(" ]");
    if ((result != 0) || (acutest_timer_ == 0)) goto LAB_00115cad;
    pcVar1 = "  ";
  }
  printf(pcVar1);
  acutest_timer_print_diff_();
LAB_00115cad:
  putchar(10);
  return;
}

Assistant:

static void
acutest_finish_test_line_(int result)
{
    if(acutest_tap_) {
        const char* str = (result == 0) ? "ok" : "not ok";

        printf("%s %d - %s\n", str, acutest_current_index_ + 1, acutest_current_test_->name);

        if(result == 0  &&  acutest_timer_) {
            printf("# Duration: ");
            acutest_timer_print_diff_();
            printf("\n");
        }
    } else {
        int color = (result == 0) ? ACUTEST_COLOR_GREEN_INTENSIVE_ : ACUTEST_COLOR_RED_INTENSIVE_;
        const char* str = (result == 0) ? "OK" : "FAILED";
        printf("[ ");
        acutest_colored_printf_(color, "%s", str);
        printf(" ]");

        if(result == 0  &&  acutest_timer_) {
            printf("  ");
            acutest_timer_print_diff_();
        }

        printf("\n");
    }
}